

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_new_points.cpp
# Opt level: O2

void initialize_interim_value_and_feedback(Am_Object *inter)

{
  bool bVar1;
  Am_Value_Type AVar2;
  Am_Value *in_value;
  Am_Wrapper *pAVar3;
  Am_Object local_50;
  Am_Object feedback;
  Am_Object new_owner;
  Am_Inter_Location inter_data;
  Am_Object local_30;
  Am_Object local_28;
  Am_Object local_20;
  Am_Object local_18;
  
  Am_Inter_Location::Am_Inter_Location(&inter_data);
  AVar2 = Am_Object::Get_Slot_Type(inter,0x16a,0);
  if ((AVar2 & 0x7000) == 0x2000) {
    Am_Object::Make_Unique(inter,0x16a);
  }
  else {
    Am_Object::Am_Object(&local_18,&Am_No_Object);
    Am_Inter_Location::Set_Location(&inter_data,false,&local_18,0,0,0,0,true);
    Am_Object::~Am_Object(&local_18);
    pAVar3 = Am_Inter_Location::operator_cast_to_Am_Wrapper_(&inter_data);
    Am_Object::Set(inter,0x16a,pAVar3,0);
  }
  in_value = Am_Object::Get(inter,0xdc,0);
  Am_Object::Am_Object(&feedback,in_value);
  new_owner.data = (Am_Object_Data *)0x0;
  bVar1 = Am_Object::Valid(&feedback);
  if (bVar1) {
    Am_Object::Am_Object(&local_20,&Am_Window);
    bVar1 = Am_Object::Is_Instance_Of(&feedback,&local_20);
    Am_Object::~Am_Object(&local_20);
    Am_Check_And_Fix_Feedback_Group(&local_50,&feedback);
    Am_Object::operator=(&new_owner,&local_50);
    Am_Object::~Am_Object(&local_50);
    if (bVar1) {
      Am_Object::Am_Object(&local_28,inter);
      Am_Object::Am_Object(&local_30,&feedback);
      Am_Add_Remove_Inter_To_Extra_Window(&local_28,&local_30,true,true);
      Am_Object::~Am_Object(&local_30);
      Am_Object::~Am_Object(&local_28);
    }
  }
  bVar1 = Am_Object::Valid(&new_owner);
  if (bVar1) {
    pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&new_owner);
    Am_Object::Set(inter,0x170,pAVar3,1);
  }
  else {
    Am_Object::Get_Owner(&local_50,(Am_Slot_Flags)inter);
    pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&local_50);
    Am_Object::Set(inter,0x170,pAVar3,1);
    Am_Object::~Am_Object(&local_50);
  }
  Am_Object::~Am_Object(&new_owner);
  Am_Object::~Am_Object(&feedback);
  Am_Inter_Location::~Am_Inter_Location(&inter_data);
  return;
}

Assistant:

void
initialize_interim_value_and_feedback(Am_Object inter)
{
  Am_Inter_Location inter_data;
  if (Am_Type_Class(inter.Get_Slot_Type(Am_INTERIM_VALUE)) == Am_WRAPPER) {
    inter.Make_Unique(Am_INTERIM_VALUE);
  } else {
    //set up with some temporary values
    inter_data.Set_Location(false, Am_No_Object, 0, 0, 0, 0);
    inter.Set(Am_INTERIM_VALUE, inter_data);
  }

  Am_Object feedback = inter.Get(Am_FEEDBACK_OBJECT);
  Am_Object new_owner;
  if (feedback.Valid()) {
#ifdef DEBUG
    //test for a frequent bug:
    if (!feedback.Get_Owner().Valid() || !feedback.Get(Am_WINDOW).Valid()) {
      std::cout << "** AMULET WARNING: feedback object " << feedback
                << " in interactor " << inter
                << " does not seem to be in a group or window,"
                << " so it won't be visible\n"
                << std::flush;
    }
#endif
    bool feedback_is_window = feedback.Is_Instance_Of(Am_Window);
    new_owner = Am_Check_And_Fix_Feedback_Group(feedback, inter);
    if (feedback_is_window)
      Am_Add_Remove_Inter_To_Extra_Window(inter, feedback, true, true);
  }
  if (new_owner.Valid())
    inter.Set(Am_SAVED_OLD_OWNER, new_owner, Am_OK_IF_NOT_THERE);
  else
    inter.Set(Am_SAVED_OLD_OWNER, inter.Get_Owner(), Am_OK_IF_NOT_THERE);
}